

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::crn_unpacker::unpack_etc1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  char cVar1;
  uint16 uVar2;
  uint32 uVar3;
  uint uVar4;
  uint32 uVar5;
  uint *puVar6;
  block_buffer_element *pbVar7;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  uint c_1;
  uint c;
  uint32 diff;
  uint32 flip;
  uint32 selector_index;
  uint8 e1 [4];
  uint8 e0 [4];
  uint8 block_endpoint [4];
  uint8 endpoint_reference;
  block_buffer_element *buffer;
  uint32 x;
  bool visible;
  uint32 y;
  uint32 *pData;
  uint32 f;
  uint8 reference_group;
  uint32 diagonal_color_endpoint_index;
  uint32 color_endpoint_index;
  int32 delta_pitch_in_dwords;
  uint32 height;
  uint32 width;
  uint32 num_color_endpoints;
  byte local_a4;
  uint32 in_stack_ffffffffffffff64;
  undefined2 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  undefined4 in_stack_ffffffffffffff6c;
  uint uVar8;
  uint local_84;
  uint local_80;
  undefined4 local_6d;
  undefined4 local_69;
  undefined4 local_65;
  byte local_61;
  block_buffer_element *local_60;
  uint local_54;
  byte local_4d;
  uint local_4c;
  undefined4 *local_48;
  uint local_3c;
  byte local_35;
  uint local_34;
  uint32 local_30;
  int local_2c;
  uint local_28;
  uint local_24;
  uint32 local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  long local_10;
  
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_20 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x110));
  local_24 = local_18 + 1 & 0xfffffffe;
  local_28 = local_1c + 1 & 0xfffffffe;
  local_2c = (local_14 >> 2) + local_24 * -2;
  uVar3 = vector<crnd::crn_unpacker::block_buffer_element>::size
                    ((vector<crnd::crn_unpacker::block_buffer_element> *)(in_RDI + 0x170));
  if (uVar3 < local_24 << 1) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize
              ((vector<crnd::crn_unpacker::block_buffer_element> *)
               CONCAT44(in_stack_ffffffffffffff6c,
                        CONCAT13(in_stack_ffffffffffffff6b,
                                 CONCAT12(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68))),
               in_stack_ffffffffffffff64);
  }
  local_30 = 0;
  local_34 = 0;
  local_35 = 0;
  local_3c = 0;
  while (uVar8 = local_3c,
        uVar4 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)(*(long *)(in_RDI + 0x18) + 0x11)), uVar8 < uVar4) {
    local_48 = *(undefined4 **)(local_10 + (ulong)local_3c * 8);
    for (local_4c = 0; local_4c < local_28; local_4c = local_4c + 1) {
      local_4d = local_4c < local_1c;
      for (local_54 = 0; local_54 < local_24; local_54 = local_54 + 1) {
        local_4d = (local_4d & 1) != 0 && local_54 < local_18;
        local_60 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                             ((vector<crnd::crn_unpacker::block_buffer_element> *)(in_RDI + 0x170),
                              local_54 << 1);
        if ((local_4c & 1) == 0) {
          uVar3 = symbol_codec::decode
                            ((symbol_codec *)(in_RDI + 0x20),
                             (static_huffman_data_model *)(in_RDI + 0x48));
          local_35 = (byte)uVar3;
          local_61 = local_35 & 3 | (byte)((int)(uVar3 & 0xff) >> 2) & 0xc;
          local_60->endpoint_reference =
               (ushort)((int)(uVar3 & 0xff) >> 2) & 3 | (ushort)((int)(uVar3 & 0xff) >> 4) & 0xc;
        }
        else {
          local_61 = (byte)local_60->endpoint_reference;
        }
        if ((local_61 & 3) == 0) {
          uVar3 = symbol_codec::decode
                            ((symbol_codec *)(in_RDI + 0x20),
                             (static_huffman_data_model *)(in_RDI + 0x70));
          local_30 = uVar3 + local_30;
          if (local_20 <= local_30) {
            local_30 = local_30 - local_20;
          }
          local_60->color_endpoint_index = (uint16)local_30;
        }
        else if ((local_61 & 3) == 1) {
          local_60->color_endpoint_index = (uint16)local_30;
        }
        else if ((local_61 & 3) == 3) {
          local_30 = local_34;
          local_60->color_endpoint_index = (uint16)local_34;
        }
        else {
          local_30 = (uint32)local_60->color_endpoint_index;
        }
        local_61 = (byte)((int)(uint)local_61 >> 2);
        puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x110),local_30)
        ;
        local_69 = *puVar6;
        uVar3 = symbol_codec::decode
                          ((symbol_codec *)(in_RDI + 0x20),
                           (static_huffman_data_model *)(in_RDI + 0xc0));
        if (local_61 != 0) {
          uVar5 = symbol_codec::decode
                            ((symbol_codec *)(in_RDI + 0x20),
                             (static_huffman_data_model *)(in_RDI + 0x70));
          local_30 = uVar5 + local_30;
          if (local_20 <= local_30) {
            local_30 = local_30 - local_20;
          }
        }
        pbVar7 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           ((vector<crnd::crn_unpacker::block_buffer_element> *)(in_RDI + 0x170),
                            local_54 << 1 | 1);
        local_34 = (uint)pbVar7->color_endpoint_index;
        uVar2 = (uint16)local_30;
        pbVar7 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           ((vector<crnd::crn_unpacker::block_buffer_element> *)(in_RDI + 0x170),
                            local_54 << 1 | 1);
        pbVar7->color_endpoint_index = uVar2;
        puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x110),local_30)
        ;
        local_6d = *puVar6;
        uVar8 = local_6d;
        if ((local_4d & 1) != 0) {
          uVar4 = (int)(uint)local_61 >> 1 ^ 1;
          cVar1 = '\x01';
          for (local_80 = 0; cVar1 != '\0' && local_80 < 3; local_80 = local_80 + 1) {
            if ((*(byte *)((long)&local_69 + (ulong)local_80) + 3 <
                 (uint)*(byte *)((long)&local_6d + (ulong)local_80)) ||
               (*(byte *)((long)&local_6d + (ulong)local_80) + 4 <
                (uint)*(byte *)((long)&local_69 + (ulong)local_80))) {
              cVar1 = '\0';
            }
          }
          for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
            if (cVar1 == '\0') {
              local_a4 = (*(byte *)((long)&local_69 + (ulong)local_84) & 0x1e) << 3 |
                         (byte)((int)(uint)*(byte *)((long)&local_6d + (ulong)local_84) >> 1);
            }
            else {
              local_a4 = *(char *)((long)&local_69 + (ulong)local_84) << 3 |
                         *(char *)((long)&local_6d + (ulong)local_84) -
                         *(char *)((long)&local_69 + (ulong)local_84) & 7U;
            }
            *(byte *)((long)&local_65 + (ulong)local_84) = local_a4;
          }
          local_6d._3_1_ = (char)(local_6d >> 0x18);
          local_65 = CONCAT13(local_69._3_1_ << 5 | local_6d._3_1_ << 2 | cVar1 << 1 | (byte)uVar4,
                              (undefined3)local_65);
          *local_48 = local_65;
          local_6d = uVar8;
          puVar6 = vector<unsigned_int>::operator[]
                             ((vector<unsigned_int> *)(in_RDI + 0x128),uVar3 << 1 | uVar4);
          local_48[1] = *puVar6;
        }
        local_48 = local_48 + 2;
      }
      local_48 = local_48 + local_2c;
    }
    local_3c = local_3c + 1;
  }
  return true;
}

Assistant:

bool unpack_etc1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_color_endpoints = m_color_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width << 1)
      m_block_buffer.resize(width << 1);

    uint32 color_endpoint_index = 0, diagonal_color_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          block_buffer_element &buffer = m_block_buffer[x << 1];
          uint8 endpoint_reference, block_endpoint[4], e0[4], e1[4];
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            reference_group = m_codec.decode(m_reference_encoding_dm);
            endpoint_reference = (reference_group & 3) | (reference_group >> 2 & 12);
            buffer.endpoint_reference = (reference_group >> 2 & 3) | (reference_group >> 4 & 12);
          }
          if (!(endpoint_reference & 3)) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
            buffer.color_endpoint_index = color_endpoint_index;
          } else if ((endpoint_reference & 3) == 1) {
            buffer.color_endpoint_index = color_endpoint_index;
          } else if ((endpoint_reference & 3) == 3) {
            buffer.color_endpoint_index = color_endpoint_index = diagonal_color_endpoint_index;
          } else {
            color_endpoint_index = buffer.color_endpoint_index;
          }
          endpoint_reference >>= 2;
          *(uint32*)&e0 = m_color_endpoints[color_endpoint_index];
          uint32 selector_index = m_codec.decode(m_selector_delta_dm[0]);
          if (endpoint_reference) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
          }
          diagonal_color_endpoint_index = m_block_buffer[x << 1 | 1].color_endpoint_index;
          m_block_buffer[x << 1 | 1].color_endpoint_index = color_endpoint_index;
          *(uint32*)&e1 = m_color_endpoints[color_endpoint_index];
          if (visible) {
            uint32 flip = endpoint_reference >> 1 ^ 1, diff = 1;
            for (uint c = 0; diff && c < 3; c++)
              diff = e0[c] + 3 >= e1[c] && e1[c] + 4 >= e0[c] ? diff : 0;
            for (uint c = 0; c < 3; c++)
              block_endpoint[c] = diff ? e0[c] << 3 | ((e1[c] - e0[c]) & 7) : (e0[c] << 3 & 0xF0) | e1[c] >> 1;
            block_endpoint[3] = e0[3] << 5 | e1[3] << 2 | diff << 1 | flip;
            pData[0] = *(uint32*)&block_endpoint;
            pData[1] = m_color_selectors[selector_index << 1 | flip];
          }
        }
      }
    }
    return true;
  }